

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadDesc(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Desc *ds)

{
  SPxId *pSVar1;
  pointer pnVar2;
  Status *pSVar3;
  bool bVar4;
  type_conflict5 tVar5;
  Status SVar6;
  SPxOut *pSVar7;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  double *pdVar9;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int local_dc;
  long local_d8;
  Verbosity old_verbosity;
  uint uStack_cc;
  cpp_dec_float<100U,_int,_void> local_80;
  
  pSVar7 = this->spxout;
  if ((pSVar7 != (SPxOut *)0x0) && (4 < (int)pSVar7->m_verbosity)) {
    old_verbosity = pSVar7->m_verbosity;
    local_80.data._M_elems[0] = 5;
    (*pSVar7->_vptr_SPxOut[2])();
    pSVar7 = soplex::operator<<(this->spxout,"IBASIS02 loading of Basis invalidates factorization");
    std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
  }
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  this->lastidx = -1;
  this->iterCount = 0;
  this->updateCount = 0;
  if (&this->thedesc != ds) {
    Desc::operator=(&this->thedesc,ds);
    setRep(this);
  }
  this->nzCount = 0;
  lVar13 = 0;
  lVar12 = 0;
  iVar10 = 0;
  while( true ) {
    this_00 = this->theLP;
    lVar11 = (long)(this_00->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar11 <= lVar12) break;
    if ((this->thedesc).rowstat.data[lVar12] < ~P_FREE) {
      bVar4 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)(((this_00->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).
                                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .left.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + lVar13),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)(((this_00->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).
                                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .right.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + lVar13));
      if (bVar4) {
        (this->thedesc).rowstat.data[lVar12] = P_FIXED;
        SVar6 = P_FIXED;
      }
      else {
        pnVar2 = (this->theLP->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_d8 = lVar11;
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,-*pdVar9,(type *)0x0);
        tVar5 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)(pnVar2->m_backend).data._M_elems + lVar13),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity);
        if (tVar5) {
          pnVar2 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&local_80,*pdVar9,(type *)0x0);
          tVar5 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)(pnVar2->m_backend).data._M_elems + lVar13),
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_80);
          if ((tVar5) || (SVar6 = (this->thedesc).rowstat.data[lVar12], SVar6 == P_ON_LOWER)) {
LAB_002e86a9:
            (this->thedesc).rowstat.data[lVar12] = P_ON_LOWER;
            SVar6 = P_ON_LOWER;
            lVar11 = local_d8;
            goto LAB_002e8711;
          }
          if (SVar6 != P_ON_UPPER) {
            local_dc = 0;
            tVar5 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(((this->theLP->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).
                                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           .object.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                         data._M_elems + lVar13),&local_dc);
            if (tVar5) goto LAB_002e86a9;
          }
        }
        pnVar2 = (this->theLP->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,*pdVar9,(type *)0x0);
        tVar5 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)(pnVar2->m_backend).data._M_elems + lVar13),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity);
        pSVar3 = (this->thedesc).rowstat.data;
        lVar11 = local_d8;
        if (tVar5) {
          pSVar3[lVar12] = P_ON_UPPER;
          SVar6 = P_ON_UPPER;
        }
        else {
          pSVar3[lVar12] = P_FREE;
          SVar6 = P_FREE;
        }
      }
    }
    else {
      SVar6 = dualRowStatus(this,(int)lVar12);
      (this->thedesc).rowstat.data[lVar12] = SVar6;
    }
LAB_002e8711:
    this_00 = this->theLP;
    if (0 < SVar6 * this_00->theRep) {
      if (iVar10 == (this->matrix).thesize) break;
      _old_verbosity =
           (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rId(&this_00->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ,(int)lVar12);
      pSVar1 = (this->theBaseId).data;
      pSVar1[iVar10].super_DataKey = _old_verbosity;
      pSVar1[iVar10].super_DataKey.info = -1;
      pSVar8 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::vector(this->theLP,(SPxRowId *)&old_verbosity);
      (this->matrix).data[iVar10] = pSVar8;
      this->nzCount = this->nzCount + (this->matrix).data[iVar10]->memused;
      iVar10 = iVar10 + 1;
    }
    lVar12 = lVar12 + 1;
    lVar13 = lVar13 + 0x50;
  }
  lVar14 = 0;
  local_d8 = lVar11;
  for (lVar13 = 0;
      lVar13 < (this_00->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar13 = lVar13 + 1) {
    if ((this->thedesc).colstat.data[lVar13] < ~P_FREE) {
      bVar4 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)(((this_00->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .low.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + lVar14),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)(((this_00->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .up.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + lVar14));
      if (bVar4) {
        (this->thedesc).colstat.data[lVar13] = P_FIXED;
        SVar6 = P_FIXED;
      }
      else {
        pnVar2 = (this->theLP->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,-*pdVar9,(type *)0x0);
        tVar5 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)(pnVar2->m_backend).data._M_elems + lVar14),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity);
        if (tVar5) {
          pnVar2 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&local_80,*pdVar9,(type *)0x0);
          tVar5 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)(pnVar2->m_backend).data._M_elems + lVar14),
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_80);
          if ((tVar5) || (SVar6 = (this->thedesc).colstat.data[lVar13], SVar6 == P_ON_LOWER)) {
LAB_002e8891:
            (this->thedesc).colstat.data[lVar13] = P_ON_LOWER;
            SVar6 = P_ON_LOWER;
            goto LAB_002e88f0;
          }
          if (SVar6 != P_ON_UPPER) {
            local_dc = 0;
            tVar5 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(((this->theLP->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           .object.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                         data._M_elems + lVar14),&local_dc);
            if (tVar5) goto LAB_002e8891;
          }
        }
        pnVar2 = (this->theLP->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,*pdVar9,(type *)0x0);
        tVar5 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)(pnVar2->m_backend).data._M_elems + lVar14),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity);
        pSVar3 = (this->thedesc).colstat.data;
        if (tVar5) {
          pSVar3[lVar13] = P_ON_UPPER;
          SVar6 = P_ON_UPPER;
        }
        else {
          pSVar3[lVar13] = P_FREE;
          SVar6 = P_FREE;
        }
      }
    }
    else {
      SVar6 = dualColStatus(this,(int)lVar13);
      (this->thedesc).colstat.data[lVar13] = SVar6;
    }
LAB_002e88f0:
    this_00 = this->theLP;
    if (0 < SVar6 * this_00->theRep) {
      if (iVar10 == (this->matrix).thesize) goto LAB_002e8971;
      _old_verbosity =
           (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::cId(&this_00->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ,(int)lVar13);
      pSVar1 = (this->theBaseId).data;
      pSVar1[iVar10].super_DataKey = _old_verbosity;
      pSVar1[iVar10].super_DataKey.info = 1;
      pSVar8 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::vector(this->theLP,(SPxColId *)&old_verbosity);
      (this->matrix).data[iVar10] = pSVar8;
      this->nzCount = this->nzCount + (this->matrix).data[iVar10]->memused;
      this_00 = this->theLP;
      iVar10 = iVar10 + 1;
    }
    lVar14 = lVar14 + 0x50;
  }
  if ((lVar12 < local_d8) || (iVar10 < (this->matrix).thesize)) {
LAB_002e8971:
    restoreInitialBasis(this);
  }
  else {
    this->matrixIsSetup = true;
  }
  this->factorized = false;
  if (this->factor !=
      (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadDesc(const Desc& ds)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);
   assert(ds.nRows() == theLP->nRows());
   assert(ds.nCols() == theLP->nCols());

   SPxId none;
   int   i;
   int   j;
   bool consistent = true;

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS02 loading of Basis invalidates factorization"
                 << std::endl;)

   lastin      = none;
   lastout     = none;
   lastidx     = -1;
   iterCount   = 0;
   updateCount = 0;

   if(&ds != &thedesc)
   {
      thedesc = ds;
      setRep();
   }

   assert(theLP->dim() == matrix.size());

   nzCount = 0;

   for(j = i = 0; i < theLP->nRows(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.rowStatus(i) >= 0)
         thedesc.rowStatus(i) = dualRowStatus(i);
      else if(theLP->SPxLPBase<R>::lhs(i) == theLP->SPxLPBase<R>::rhs(i))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lhs(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::rhs(i) >= R(infinity)
                  || thedesc.rowStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.rowStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxRowObj(i) <= 0)))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::rhs(i) < R(infinity))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxRowId id = theLP->SPxLPBase<R>::rId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   for(i = 0; i < theLP->nCols(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.colStatus(i) >= 0)
         thedesc.colStatus(i) = dualColStatus(i);
      else if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::upper(i) >= R(infinity)
                  || thedesc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.colStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxObj(i) <= 0)))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.colStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxColId id = theLP->SPxLPBase<R>::cId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   if(j < matrix.size())
      consistent = false;  // not enough basic variables

   /* if dimensions are inconsistent, restore slack basis
    * if dimensions are consistent, then we have setup a correct matrix
    */
   if(!consistent)
      restoreInitialBasis();
   else
      matrixIsSetup = true;

   assert(isDescValid(thedesc));

   factorized = false;

   if(factor != nullptr)
      factor->clear();
}